

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O2

void __thiscall re2c::OutputFile::~OutputFile(OutputFile *this)

{
  FILE *__stream;
  pointer ppOVar1;
  OutputBlock *this_00;
  uint uVar2;
  
  __stream = (FILE *)this->file;
  if ((__stream != (FILE *)0x0) && (__stream != _stdout)) {
    fclose(__stream);
  }
  uVar2 = 0;
  while( true ) {
    ppOVar1 = (this->blocks).
              super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->blocks).
                      super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppOVar1 >> 3) <=
        (ulong)uVar2) break;
    this_00 = ppOVar1[uVar2];
    if (this_00 != (OutputBlock *)0x0) {
      OutputBlock::~OutputBlock(this_00);
    }
    operator_delete(this_00,0x48);
    uVar2 = uVar2 + 1;
  }
  std::_Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>::~_Vector_base
            (&(this->blocks).
              super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>);
  return;
}

Assistant:

OutputFile::~OutputFile ()
{
	if (file != NULL && file != stdout)
	{
		fclose (file);
	}
	for (unsigned int i = 0; i < blocks.size (); ++i)
	{
		delete blocks[i];
	}
}